

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objectivec_file.cc
# Opt level: O0

bool google::protobuf::compiler::objectivec::anon_unknown_0::MessageContainsEnums
               (Descriptor *message)

{
  bool bVar1;
  int iVar2;
  Descriptor *message_00;
  int local_1c;
  int i;
  Descriptor *message_local;
  
  iVar2 = Descriptor::enum_type_count(message);
  if (iVar2 < 1) {
    for (local_1c = 0; iVar2 = Descriptor::nested_type_count(message), local_1c < iVar2;
        local_1c = local_1c + 1) {
      message_00 = Descriptor::nested_type(message,local_1c);
      bVar1 = MessageContainsEnums(message_00);
      if (bVar1) {
        return true;
      }
    }
    message_local._7_1_ = false;
  }
  else {
    message_local._7_1_ = true;
  }
  return message_local._7_1_;
}

Assistant:

bool MessageContainsEnums(const Descriptor* message) {
  if (message->enum_type_count() > 0) {
    return true;
  }
  for (int i = 0; i < message->nested_type_count(); i++) {
    if (MessageContainsEnums(message->nested_type(i))) {
      return true;
    }
  }
  return false;
}